

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O3

rt_expr<viennamath::rt_expression_interface<double>_>
viennamath::operator*
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *lhs,
          rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs)

{
  pointer prVar1;
  undefined8 *puVar2;
  _func_int **pp_Var3;
  int iVar4;
  undefined4 extraout_var;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  rt_expression_interface<double> *prVar7;
  undefined4 extraout_var_01;
  long lVar8;
  long in_RDX;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other;
  void *in_R8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  rt_expr<viennamath::rt_expression_interface<double>_> *result;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_78;
  undefined **local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *local_38;
  
  prVar1 = (rhs->
           super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ).
           super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(rhs->
                super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ).
                super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)prVar1;
  local_38 = rhs;
  if (lVar8 != 0) {
    puVar2 = *(undefined8 **)(in_RDX + 8);
    if (lVar8 == *(long *)(in_RDX + 0x10) - (long)puVar2) {
      iVar4 = (*((prVar1->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
      poVar5 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
      poVar5->_vptr_op_interface = (_func_int **)&PTR__op_interface_00116b20;
      local_78.rhs_._M_ptr =
           (rt_expression_interface<double> *)(**(code **)(*(long *)*puVar2 + 0x10))();
      other = &local_78;
      local_78.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_binary_expr_00116490;
      local_78.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar4);
      local_78.op_._M_ptr = poVar5;
      rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
                ((rt_expr<viennamath::rt_expression_interface<double>_> *)lhs,other);
      local_78.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_binary_expr_00116490;
      if (local_78.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_78.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      if (local_78.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0)
      {
        (*(local_78.op_._M_ptr)->_vptr_op_interface[1])();
      }
      if (local_78.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_78.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      lVar10 = *(long *)(in_RDX + 8);
      if (8 < (ulong)(*(long *)(in_RDX + 0x10) - lVar10)) {
        uVar9 = 1;
        do {
          iVar4 = (*((local_38->
                     super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ).
                     super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9].rt_expr_._M_ptr)->
                    _vptr_rt_expression_interface[2])();
          plVar6 = (long *)operator_new(8);
          *plVar6 = (long)&PTR__op_interface_00116b20;
          local_40 = (long *)(**(code **)(**(long **)(lVar10 + uVar9 * 8) + 0x10))();
          local_58 = &PTR__rt_binary_expr_00116490;
          local_50 = (long *)CONCAT44(extraout_var_00,iVar4);
          local_48 = plVar6;
          prVar7 = (rt_expression_interface<double> *)
                   (**(code **)(*(lhs->super_rt_expression_interface<double>).
                                 _vptr_rt_expression_interface + 0x10))();
          poVar5 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
          poVar5->_vptr_op_interface = (_func_int **)&PTR__op_interface_00116c00;
          auVar11 = (*(code *)local_58[2])(&local_58);
          local_78.rhs_._M_ptr = auVar11._0_8_;
          local_78.super_rt_expression_interface<double>._vptr_rt_expression_interface =
               (_func_int **)&PTR__rt_binary_expr_00116490;
          local_78.lhs_._M_ptr = prVar7;
          local_78.op_._M_ptr = poVar5;
          iVar4 = rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                            (&local_78,(__fn *)other,auVar11._8_8_,(int)lVar8,in_R8);
          pp_Var3 = (lhs->super_rt_expression_interface<double>)._vptr_rt_expression_interface;
          if (pp_Var3 != (_func_int **)CONCAT44(extraout_var_01,iVar4)) {
            if (pp_Var3 != (_func_int **)0x0) {
              (**(code **)(*pp_Var3 + 8))();
            }
            (lhs->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
                 (_func_int **)CONCAT44(extraout_var_01,iVar4);
          }
          local_78.super_rt_expression_interface<double>._vptr_rt_expression_interface =
               (_func_int **)&PTR__rt_binary_expr_00116490;
          if (local_78.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_78.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          if (local_78.op_._M_ptr !=
              (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
            (*(local_78.op_._M_ptr)->_vptr_op_interface[1])();
          }
          if (local_78.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_78.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          local_58 = &PTR__rt_binary_expr_00116490;
          if (local_40 != (long *)0x0) {
            (**(code **)(*local_40 + 8))();
          }
          if (local_48 != (long *)0x0) {
            (**(code **)(*local_48 + 8))();
          }
          if (local_50 != (long *)0x0) {
            (**(code **)(*local_50 + 8))();
          }
          uVar9 = uVar9 + 1;
          lVar10 = *(long *)(in_RDX + 8);
        } while (uVar9 < (ulong)(*(long *)(in_RDX + 0x10) - lVar10 >> 3));
      }
      return (rt_expr<viennamath::rt_expression_interface<double>_>)
             (auto_ptr<const_viennamath::rt_expression_interface<double>_>)lhs;
    }
  }
  __assert_fail("lhs.size() == rhs.size() && lhs.size() > 0 && \"Invalid or nonmatching size in expression vectors\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/viennamath/runtime/vector_expr.hpp"
                ,0x10e,
                "rt_expr<InterfaceType> viennamath::operator*(const rt_vector_expr<InterfaceType> &, const rt_vector_expr<InterfaceType> &) [InterfaceType = viennamath::rt_expression_interface<double>]"
               );
}

Assistant:

rt_expr<InterfaceType> operator*(rt_vector_expr<InterfaceType> const & lhs, rt_vector_expr<InterfaceType> const & rhs)
  {
    assert(lhs.size() == rhs.size() && lhs.size() > 0 && "Invalid or nonmatching size in expression vectors");

    rt_expr<InterfaceType> result = lhs[0] * rhs[0];
    for (std::size_t i=1; i<rhs.size(); ++i)
      result = result + lhs[i] * rhs[i];

    return result;
  }